

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix4d * tinyusdz::to_matrix(matrix4d *__return_storage_ptr__,quatf *q)

{
  const_reference pvVar1;
  V *pVVar2;
  double *pdVar3;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  vec<double,_4> local_78;
  undefined1 local_58 [8];
  double3x3 m33;
  quatf *q_local;
  
  m33.z.z = (double)q;
  pvVar1 = ::std::array<float,_3UL>::operator[](&q->imag,0);
  local_80 = (double)*pvVar1;
  pvVar1 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)m33.z.z,1);
  local_88 = (double)*pvVar1;
  pvVar1 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)m33.z.z,2);
  local_90 = (double)*pvVar1;
  local_98 = (double)*(float *)((long)m33.z.z + 0xc);
  linalg::vec<double,_4>::vec(&local_78,&local_80,&local_88,&local_90,&local_98);
  linalg::qmat<double>((mat<double,_3,_3> *)local_58,&local_78);
  value::matrix4d::matrix4d(__return_storage_ptr__);
  Identity(__return_storage_ptr__);
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,0);
  __return_storage_ptr__->m[0][0] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,1);
  __return_storage_ptr__->m[0][1] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,2);
  __return_storage_ptr__->m[0][2] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,1);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,0);
  __return_storage_ptr__->m[1][0] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,1);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,1);
  __return_storage_ptr__->m[1][1] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,1);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,2);
  __return_storage_ptr__->m[1][2] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,2);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,0);
  __return_storage_ptr__->m[2][0] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,2);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,1);
  __return_storage_ptr__->m[2][1] = *pdVar3;
  pVVar2 = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,2);
  pdVar3 = linalg::vec<double,_3>::operator[](pVVar2,2);
  __return_storage_ptr__->m[2][2] = *pdVar3;
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d to_matrix(const value::quatf &q) {
  double3x3 m33 = linalg::qmat<double>({double(q.imag[0]), double(q.imag[1]),
                                        double(q.imag[2]), double(q.real)});

  value::matrix4d m;
  Identity(&m);

  m.m[0][0] = m33[0][0];
  m.m[0][1] = m33[0][1];
  m.m[0][2] = m33[0][2];
  m.m[1][0] = m33[1][0];
  m.m[1][1] = m33[1][1];
  m.m[1][2] = m33[1][2];
  m.m[2][0] = m33[2][0];
  m.m[2][1] = m33[2][1];
  m.m[2][2] = m33[2][2];

  return m;
}